

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O2

UINT8 device_start_sn76496_maxim(SN76496_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 uVar4;
  void *pvVar5;
  UINT8 UVar6;
  DEV_DATA DVar7;
  long lVar8;
  
  uVar1 = (cfg->_genCfg).clock;
  uVar2 = (cfg->_genCfg).smplRate;
  DVar7.chipInf = calloc(1,200);
  if ((DEV_DATA *)DVar7.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    *(float *)&((DEV_DATA *)((long)DVar7.chipInf + 0x30))->chipInf =
         ((float)uVar1 * 0.0625) / (float)uVar2;
    *(undefined1 *)&((DEV_DATA *)((long)DVar7.chipInf + 0x28))->chipInf = 0xf;
    *(undefined4 *)((long)DVar7.chipInf + 0x3c) = 9;
    *(undefined1 *)&((DEV_DATA *)((long)DVar7.chipInf + 0x40))->chipInf = 0x10;
    for (lVar8 = 0x9c; lVar8 != 0xbc; lVar8 = lVar8 + 8) {
      Panning_Centre((INT32 *)((long)DVar7.chipInf + lVar8));
    }
    *(undefined1 *)((long)DVar7.chipInf + 0xbc) = 0;
    ((DEV_DATA *)((long)DVar7.chipInf + 0xc0))->chipInf = (void *)0x0;
    pvVar3 = *(void **)&cfg->_genCfg;
    uVar4 = *(undefined8 *)&(cfg->_genCfg).clock;
    pvVar5 = cfg->t6w28_tone;
    ((DEV_DATA *)((long)DVar7.chipInf + 0x18))->chipInf = *(void **)&cfg->noiseTaps;
    *(void **)((long)DVar7.chipInf + 0x20) = pvVar5;
    ((DEV_DATA *)((long)DVar7.chipInf + 8))->chipInf = pvVar3;
    *(undefined8 *)((long)DVar7.chipInf + 0x10) = uVar4;
    pvVar3 = cfg->t6w28_tone;
    if (pvVar3 != (void *)0x0) {
      *(undefined1 *)((long)pvVar3 + 0xbc) = 0x80;
      *(void **)((long)pvVar3 + 0xc0) = DVar7.chipInf;
      *(undefined1 *)((long)DVar7.chipInf + 0xbc) = 0x81;
      ((DEV_DATA *)((long)DVar7.chipInf + 0xc0))->chipInf = pvVar3;
    }
    UVar6 = cfg->shiftRegWidth;
    *(uint *)((long)DVar7.chipInf + 0x3c) = (uint)cfg->noiseTaps;
    *(UINT8 *)&((DEV_DATA *)((long)DVar7.chipInf + 0x40))->chipInf = UVar6;
    *(void **)DVar7.chipInf = DVar7.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar7.chipInf;
    retDevInf->sampleRate = uVar2;
    retDevInf->devDef = &devDef_SN76489_Maxim;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar6 = '\0';
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_sn76496_maxim(const SN76496_CFG* cfg, DEV_INFO* retDevInf)
{
	SN76489_Context* chip;
	DEV_DATA* devData;
	UINT32 rate;
	
	rate = cfg->_genCfg.smplRate;
	chip = SN76489_Init(cfg->_genCfg.clock, rate);
	if (chip == NULL)
		return 0xFF;
	
	chip->cfg = *cfg;
	if (cfg->t6w28_tone != NULL)
		SN76489_ConnectT6W28(chip, (SN76489_Context*)cfg->t6w28_tone);
	SN76489_Config(chip, cfg->noiseTaps, cfg->shiftRegWidth);
	
	devData = &chip->_devData;
	devData->chipInf = chip;
	INIT_DEVINF(retDevInf, devData, rate, &devDef_SN76489_Maxim);
	return 0x00;
}